

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_disp_hdrs(nt_opts *opts)

{
  FILE *__stream;
  int iVar1;
  nifti_1_header *hdr;
  field_s *fieldp;
  char *pcVar2;
  bool local_49;
  uint local_40;
  int local_3c;
  int local_38;
  int fc;
  int filenum;
  int nfields;
  char **sptr;
  field_s *fnhdr;
  nifti_1_header *nhdr;
  nt_opts *opts_local;
  
  if ((opts->flist).len < 1) {
    local_40 = 0x2b;
  }
  else {
    local_40 = (opts->flist).len;
  }
  if (2 < g_debug) {
    fprintf(_stderr,"-d displaying %d fields for %d nifti datasets...\n",(ulong)local_40,
            (ulong)(uint)(opts->infiles).len);
  }
  local_38 = 0;
  while( true ) {
    if ((opts->infiles).len <= local_38) {
      return 0;
    }
    hdr = nt_read_header(opts,(opts->infiles).list[local_38],(int *)0x0,0);
    if (hdr == (nifti_1_header *)0x0) break;
    if (0 < g_debug) {
      fprintf(_stdout,"\nheader file \'%s\', num_fields = %d\n",(opts->infiles).list[local_38],
              (ulong)local_40);
    }
    __stream = _stderr;
    if (1 < g_debug) {
      iVar1 = nifti_hdr_looks_good(hdr);
      pcVar2 = "invalid";
      if (iVar1 != 0) {
        pcVar2 = "valid";
      }
      fprintf(__stream,"-d header is: %s\n",pcVar2);
    }
    if ((opts->flist).len < 1) {
      disp_field("\nall fields:\n",g_hdr_fields,hdr,local_40,(uint)(0 < g_debug));
    }
    else {
      _filenum = (opts->flist).list;
      for (local_3c = 0; local_3c < (opts->flist).len; local_3c = local_3c + 1) {
        fieldp = get_hdr_field(*_filenum,(uint)(local_38 == 0));
        if (fieldp != (field_s *)0x0) {
          local_49 = 0 < g_debug && local_3c == 0;
          disp_field((char *)0x0,fieldp,hdr,1,(uint)local_49);
        }
        _filenum = _filenum + 1;
      }
    }
    free(hdr);
    local_38 = local_38 + 1;
  }
  return 1;
}

Assistant:

int act_disp_hdrs( nt_opts * opts )
{
   nifti_1_header *  nhdr;
   field_s        *  fnhdr;
   char           ** sptr;
   int               nfields, filenum, fc;

   /* set the number of fields to display */
   nfields = opts->flist.len > 0 ? opts->flist.len : NT_HDR_NUM_FIELDS;

   if( g_debug > 2 )
      fprintf(stderr,"-d displaying %d fields for %d nifti datasets...\n",
              nfields, opts->infiles.len);

   for( filenum = 0; filenum < opts->infiles.len; filenum++ )
   {
      /* do not validate the header structure */
      nhdr = nt_read_header(opts, opts->infiles.list[filenum], NULL, 0);
      if( !nhdr ) return 1;  /* errors are printed from library */

      if( g_debug > 0 )
         fprintf(stdout,"\nheader file '%s', num_fields = %d\n",
                 opts->infiles.list[filenum], nfields);
      if( g_debug > 1 )
         fprintf(stderr,"-d header is: %s\n",
                 nifti_hdr_looks_good(nhdr) ? "valid" : "invalid");

      if( opts->flist.len <= 0 ) /* then display all fields */
         disp_field("\nall fields:\n", g_hdr_fields, nhdr, nfields, g_debug>0);
      else  /* print only the requested fields... */
      {
         /* must locate each field before printing it */
         sptr = opts->flist.list;
         for( fc = 0; fc < opts->flist.len; fc++ )
         {
            fnhdr = get_hdr_field(*sptr, filenum == 0);
            if( fnhdr ) disp_field(NULL, fnhdr, nhdr, 1, g_debug>0 && fc == 0);
            sptr++;
         }
      }

      free(nhdr);
   }

   return 0;
}